

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InvalidInputException::
InvalidInputException<std::__cxx11::string,unsigned_long,unsigned_long>
          (InvalidInputException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          unsigned_long params_1,unsigned_long params_2)

{
  unsigned_long in_R9;
  string sStack_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,(string *)params);
  Exception::ConstructMessage<std::__cxx11::string,unsigned_long,unsigned_long>
            (&sStack_68,(Exception *)msg,&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params_1,params_2,
             in_R9);
  InvalidInputException(this,&sStack_68);
  ::std::__cxx11::string::~string((string *)&sStack_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}